

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O1

MeshAttributeIndicesEncodingData * __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
GetAttributeEncodingData
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this,
          int att_id)

{
  pointer puVar1;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var2;
  int iVar3;
  int iVar4;
  pointer pAVar5;
  ulong uVar6;
  ulong uVar7;
  MeshAttributeIndicesEncodingData *pMVar8;
  bool bVar9;
  bool bVar10;
  MeshAttributeIndicesEncodingData *local_38;
  
  pAVar5 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar9 = (this->attribute_data_).
          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
          ._M_impl.super__Vector_impl_data._M_finish != pAVar5;
  if (bVar9) {
    uVar7 = 0;
    do {
      iVar3 = pAVar5[uVar7].decoder_id;
      bVar10 = false;
      if ((-1 < (long)iVar3) &&
         (puVar1 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.attributes_decoders_.
                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         iVar3 < (int)((ulong)((long)(this->decoder_->super_MeshDecoder).super_PointCloudDecoder.
                                     attributes_decoders_.
                                     super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3
                      ))) {
        _Var2._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
             puVar1[iVar3]._M_t.
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t;
        iVar3 = (**(code **)(*(long *)_Var2._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      .
                                      super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                      ._M_head_impl + 0x30))
                          (_Var2._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                           _M_head_impl);
        if (iVar3 < 1) {
          bVar10 = false;
        }
        else {
          iVar3 = 0;
          do {
            iVar4 = (**(code **)(*(long *)_Var2._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                          .
                                          super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                          ._M_head_impl + 0x28))
                              (_Var2._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                               _M_head_impl,iVar3);
            if (iVar4 == att_id) {
              local_38 = &(this->attribute_data_).
                          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].encoding_data;
              bVar10 = true;
              goto LAB_00122fc7;
            }
            iVar3 = iVar3 + 1;
            iVar4 = (**(code **)(*(long *)_Var2._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                          .
                                          super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                          ._M_head_impl + 0x30))
                              (_Var2._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                               _M_head_impl);
          } while (iVar3 < iVar4);
          bVar10 = false;
        }
      }
LAB_00122fc7:
      if (bVar10) break;
      uVar7 = (ulong)((int)uVar7 + 1);
      pAVar5 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 6) *
              -0x3333333333333333;
      bVar10 = uVar6 - uVar7 != 0;
      bVar9 = uVar7 <= uVar6 && bVar10;
    } while (uVar7 <= uVar6 && bVar10);
  }
  pMVar8 = &this->pos_encoding_data_;
  if (bVar9) {
    pMVar8 = local_38;
  }
  return pMVar8;
}

Assistant:

const MeshAttributeIndicesEncodingData *
MeshEdgebreakerDecoderImpl<TraversalDecoder>::GetAttributeEncodingData(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    const int decoder_id = attribute_data_[i].decoder_id;
    if (decoder_id < 0 || decoder_id >= decoder_->num_attributes_decoders()) {
      continue;
    }
    const AttributesDecoderInterface *const dec =
        decoder_->attributes_decoder(decoder_id);
    for (int j = 0; j < dec->GetNumAttributes(); ++j) {
      if (dec->GetAttributeId(j) == att_id) {
        return &attribute_data_[i].encoding_data;
      }
    }
  }
  return &pos_encoding_data_;
}